

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3MallocAlarm(int nByte)

{
  _func_void_void_ptr_sqlite3_int64_int *p_Var1;
  void *pvVar2;
  long lVar3;
  
  pvVar2 = mem0.alarmArg;
  p_Var1 = mem0.alarmCallback;
  if (mem0.alarmCallback != (_func_void_void_ptr_sqlite3_int64_int *)0x0) {
    mem0.alarmCallback = (_func_void_void_ptr_sqlite3_int64_int *)0x0;
    lVar3 = (long)sqlite3Stat.nowValue[0];
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
    }
    (*p_Var1)(pvVar2,lVar3,nByte);
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
    }
  }
  mem0.alarmCallback = p_Var1;
  mem0.alarmArg = pvVar2;
  return;
}

Assistant:

static void sqlite3MallocAlarm(int nByte){
  void (*xCallback)(void*,sqlite3_int64,int);
  sqlite3_int64 nowUsed;
  void *pArg;
  if( mem0.alarmCallback==0 ) return;
  xCallback = mem0.alarmCallback;
  nowUsed = sqlite3StatusValue(SQLITE_STATUS_MEMORY_USED);
  pArg = mem0.alarmArg;
  mem0.alarmCallback = 0;
  sqlite3_mutex_leave(mem0.mutex);
  xCallback(pArg, nowUsed, nByte);
  sqlite3_mutex_enter(mem0.mutex);
  mem0.alarmCallback = xCallback;
  mem0.alarmArg = pArg;
}